

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

bool __thiscall
spvtools::Optimizer::Run
          (Optimizer *this,uint32_t *original_binary,size_t original_binary_size,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *optimized_binary,
          spv_optimizer_options opt_options)

{
  spv_target_env env;
  bool bVar1;
  int iVar2;
  pointer pIVar3;
  MessageConsumer *pMVar4;
  pointer pIVar5;
  pointer pIVar6;
  Module *pMVar7;
  size_type sVar8;
  reference pvVar9;
  uint *__s1;
  undefined1 local_b0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> optimized_binary_with_nop;
  undefined1 local_90 [4];
  Status status;
  unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_> local_70;
  unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_> context;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)> local_60;
  SpirvTools local_40;
  SpirvTools tools;
  spv_optimizer_options opt_options_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *optimized_binary_local;
  size_t original_binary_size_local;
  uint32_t *original_binary_local;
  Optimizer *this_local;
  
  tools.impl_._M_t.
  super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
  .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl =
       (unique_ptr<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>)
       (unique_ptr<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>)
       opt_options;
  pIVar3 = std::
           unique_ptr<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>::
           operator->(&this->impl_);
  SpirvTools::SpirvTools(&local_40,pIVar3->target_env);
  pIVar3 = std::
           unique_ptr<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>::
           operator->(&this->impl_);
  pMVar4 = opt::PassManager::consumer(&pIVar3->pass_manager);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  function(&local_60,pMVar4);
  SpirvTools::SetMessageConsumer(&local_40,&local_60);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  ~function(&local_60);
  if (((*(byte *)tools.impl_._M_t.
                 super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
                 .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl & 1) == 0)
     || (bVar1 = SpirvTools::Validate
                           (&local_40,original_binary,original_binary_size,
                            (spv_validator_options)
                            ((long)tools.impl_._M_t.
                                   super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
                                   .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>.
                                   _M_head_impl + 4)), bVar1)) {
    pIVar3 = std::
             unique_ptr<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
             ::operator->(&this->impl_);
    env = pIVar3->target_env;
    pMVar4 = consumer(this);
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    function((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
              *)local_90,pMVar4);
    BuildModule((spvtools *)&local_70,env,(MessageConsumer *)local_90,original_binary,
                original_binary_size);
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    ~function((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
               *)local_90);
    bVar1 = std::operator==(&local_70,(nullptr_t)0x0);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      pIVar5 = std::
               unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>
               ::operator->(&local_70);
      opt::IRContext::set_max_id_bound
                (pIVar5,*(uint32_t *)
                         ((long)tools.impl_._M_t.
                                super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
                                .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>.
                                _M_head_impl + 0x34));
      pIVar5 = std::
               unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>
               ::operator->(&local_70);
      opt::IRContext::set_preserve_bindings
                (pIVar5,(bool)(*(byte *)((long)tools.impl_._M_t.
                                               super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
                                               .
                                               super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>
                                               ._M_head_impl + 0x38) & 1));
      pIVar5 = std::
               unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>
               ::operator->(&local_70);
      opt::IRContext::set_preserve_spec_constants
                (pIVar5,(bool)(*(byte *)((long)tools.impl_._M_t.
                                               super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
                                               .
                                               super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>
                                               ._M_head_impl + 0x39) & 1));
      pIVar3 = std::
               unique_ptr<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
               ::operator->(&this->impl_);
      opt::PassManager::SetValidatorOptions
                (&pIVar3->pass_manager,
                 (spv_validator_options)
                 ((long)tools.impl_._M_t.
                        super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
                        .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl + 4
                 ));
      pIVar3 = std::
               unique_ptr<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
               ::operator->(&this->impl_);
      pIVar6 = std::
               unique_ptr<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
               ::operator->(&this->impl_);
      opt::PassManager::SetTargetEnv(&pIVar3->pass_manager,pIVar6->target_env);
      pIVar3 = std::
               unique_ptr<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
               ::operator->(&this->impl_);
      pIVar5 = std::
               unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>
               ::get(&local_70);
      optimized_binary_with_nop.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           opt::PassManager::Run(&pIVar3->pass_manager,pIVar5);
      if (optimized_binary_with_nop.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == Failure) {
        this_local._7_1_ = false;
      }
      else {
        if (optimized_binary_with_nop.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ == SuccessWithoutChange) {
          pIVar5 = std::
                   unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>
                   ::operator->(&local_70);
          pMVar7 = opt::IRContext::module(pIVar5);
          bVar1 = opt::Module::ContainsDebugInfo(pMVar7);
          if (!bVar1) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0);
            pIVar5 = std::
                     unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>
                     ::operator->(&local_70);
            pMVar7 = opt::IRContext::module(pIVar5);
            opt::Module::ToBinary
                      (pMVar7,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0,false)
            ;
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0);
            if (sVar8 != original_binary_size) {
              __assert_fail("optimized_binary_with_nop.size() == original_binary_size && \"Binary size unexpectedly changed despite the optimizer saying \" \"there was no change\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/optimizer.cpp"
                            ,0x2d1,
                            "bool spvtools::Optimizer::Run(const uint32_t *, const size_t, std::vector<uint32_t> *, const spv_optimizer_options) const"
                           );
            }
            pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0,0);
            if (*pvVar9 == *original_binary) {
              __s1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0);
              iVar2 = memcmp(__s1,original_binary,original_binary_size);
              if (iVar2 != 0) {
                __assert_fail("memcmp(optimized_binary_with_nop.data(), original_binary, original_binary_size) == 0 && \"Binary content unexpectedly changed despite the optimizer saying \" \"there was no change\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/optimizer.cpp"
                              ,0x2da,
                              "bool spvtools::Optimizer::Run(const uint32_t *, const size_t, std::vector<uint32_t> *, const spv_optimizer_options) const"
                             );
              }
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0);
          }
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(optimized_binary);
        pIVar5 = std::
                 unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>
                 ::operator->(&local_70);
        pMVar7 = opt::IRContext::module(pIVar5);
        opt::Module::ToBinary(pMVar7,optimized_binary,true);
        this_local._7_1_ = true;
      }
    }
    context._M_t.
    super___uniq_ptr_impl<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>.
    _M_t.
    super__Tuple_impl<0UL,_spvtools::opt::IRContext_*,_std::default_delete<spvtools::opt::IRContext>_>
    .super__Head_base<0UL,_spvtools::opt::IRContext_*,_false>._M_head_impl._4_4_ = 1;
    std::unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>::
    ~unique_ptr(&local_70);
  }
  else {
    this_local._7_1_ = false;
    context._M_t.
    super___uniq_ptr_impl<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>.
    _M_t.
    super__Tuple_impl<0UL,_spvtools::opt::IRContext_*,_std::default_delete<spvtools::opt::IRContext>_>
    .super__Head_base<0UL,_spvtools::opt::IRContext_*,_false>._M_head_impl._4_4_ = 1;
  }
  SpirvTools::~SpirvTools(&local_40);
  return this_local._7_1_;
}

Assistant:

bool Optimizer::Run(const uint32_t* original_binary,
                    const size_t original_binary_size,
                    std::vector<uint32_t>* optimized_binary,
                    const spv_optimizer_options opt_options) const {
  spvtools::SpirvTools tools(impl_->target_env);
  tools.SetMessageConsumer(impl_->pass_manager.consumer());
  if (opt_options->run_validator_ &&
      !tools.Validate(original_binary, original_binary_size,
                      &opt_options->val_options_)) {
    return false;
  }

  std::unique_ptr<opt::IRContext> context = BuildModule(
      impl_->target_env, consumer(), original_binary, original_binary_size);
  if (context == nullptr) return false;

  context->set_max_id_bound(opt_options->max_id_bound_);
  context->set_preserve_bindings(opt_options->preserve_bindings_);
  context->set_preserve_spec_constants(opt_options->preserve_spec_constants_);

  impl_->pass_manager.SetValidatorOptions(&opt_options->val_options_);
  impl_->pass_manager.SetTargetEnv(impl_->target_env);
  auto status = impl_->pass_manager.Run(context.get());

  if (status == opt::Pass::Status::Failure) {
    return false;
  }

#ifndef NDEBUG
  // We do not keep the result id of DebugScope in struct DebugScope.
  // Instead, we assign random ids for them, which results in integrity
  // check failures. In addition, propagating the OpLine/OpNoLine to preserve
  // the debug information through transformations results in integrity
  // check failures. We want to skip the integrity check when the module
  // contains DebugScope or OpLine/OpNoLine instructions.
  if (status == opt::Pass::Status::SuccessWithoutChange &&
      !context->module()->ContainsDebugInfo()) {
    std::vector<uint32_t> optimized_binary_with_nop;
    context->module()->ToBinary(&optimized_binary_with_nop,
                                /* skip_nop = */ false);
    assert(optimized_binary_with_nop.size() == original_binary_size &&
           "Binary size unexpectedly changed despite the optimizer saying "
           "there was no change");

    // Compare the magic number to make sure the binaries were encoded in the
    // endianness.  If not, the contents of the binaries will be different, so
    // do not check the contents.
    if (optimized_binary_with_nop[0] == original_binary[0]) {
      assert(memcmp(optimized_binary_with_nop.data(), original_binary,
                    original_binary_size) == 0 &&
             "Binary content unexpectedly changed despite the optimizer saying "
             "there was no change");
    }
  }
#endif  // !NDEBUG

  // Note that |original_binary| and |optimized_binary| may share the same
  // buffer and the below will invalidate |original_binary|.
  optimized_binary->clear();
  context->module()->ToBinary(optimized_binary, /* skip_nop = */ true);

  return true;
}